

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-shape.cpp
# Opt level: O3

Comparison __thiscall
wasm::anon_unknown_0::
RecGroupComparator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp:329:35)>
::compare(RecGroupComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_type_shape_cpp:329:35)>
          *this,Type a,Type b)

{
  byte bVar1;
  Comparison CVar2;
  HeapType a_00;
  HeapType b_00;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  ulong uVar7;
  long *plVar8;
  Type local_38;
  Type a_local;
  Type b_local;
  
  if (a.id < 7 == b.id < 7) {
    local_38.id = a.id;
    a_local = b;
    if (a.id < 7) {
      if (6 < b.id) {
        __assert_fail("isBasic() && \"Basic type expected\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                      ,0x1c4,"BasicType wasm::Type::getBasic() const");
      }
      bVar3 = a.id < b.id;
      if (a.id == b.id) {
        return EQ;
      }
LAB_00cb6cf8:
      return GT - bVar3;
    }
    bVar1 = (byte)b.id & 6 < b.id;
    if (((byte)a.id & 1) == bVar1) {
      if ((a.id & 1) != 0) {
        if (bVar1 == 0) {
          __assert_fail("isTuple()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                        ,0x177,"const Tuple &wasm::Type::getTuple() const");
        }
        plVar6 = (long *)(a.id & 0xfffffffffffffffe);
        plVar8 = (long *)(b.id & 0xfffffffffffffffe);
        lVar4 = *plVar6;
        uVar5 = plVar6[1] - lVar4 >> 3;
        uVar7 = plVar8[1] - *plVar8 >> 3;
        bVar3 = uVar5 < uVar7;
        if (uVar5 == uVar7) {
          if (plVar6[1] == lVar4) {
            return EQ;
          }
          uVar5 = 0;
          do {
            CVar2 = compare(this,(Type)*(uintptr_t *)(lVar4 + uVar5 * 8),
                            (Type)*(uintptr_t *)(*plVar8 + uVar5 * 8));
            if (CVar2 != EQ) {
              return CVar2;
            }
            uVar5 = uVar5 + 1;
            lVar4 = *plVar6;
          } while (uVar5 < (ulong)(plVar6[1] - lVar4 >> 3));
          return EQ;
        }
        goto LAB_00cb6cf8;
      }
      if ((b.id < 7) || ((b.id & 1) != 0)) {
        __assert_fail("a.isRef() && b.isRef()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp"
                      ,0x95,
                      "Comparison wasm::(anonymous namespace)::RecGroupComparator<(lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp:329:35)>::compare(Type, Type) [CompareTypes = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp:329:35)]"
                     );
      }
      if ((char)(((uint)a.id & 2) >> 1) == (char)(((uint)b.id & 2) >> 1)) {
        a_00 = wasm::Type::getHeapType(&local_38);
        b_00 = wasm::Type::getHeapType(&a_local);
        CVar2 = compare(this,a_00,b_00);
        return CVar2;
      }
      bVar3 = (bool)((a.id & 2) == 0 & (byte)(b.id >> 1) & 0x7f);
    }
    else {
      bVar3 = (bool)(bVar1 & (a.id & 1) == 0);
    }
  }
  else {
    bVar3 = a.id < 7 && 6 < b.id;
  }
  return GT - bVar3;
}

Assistant:

Comparison compare(Type a, Type b) {
    if (a.isBasic() != b.isBasic()) {
      return b.isBasic() < a.isBasic() ? LT : GT;
    }
    if (a.isBasic()) {
      if (a.getBasic() != b.getBasic()) {
        return a.getBasic() < b.getBasic() ? LT : GT;
      }
      return EQ;
    }
    if (a.isTuple() != b.isTuple()) {
      return a.isTuple() < b.isTuple() ? LT : GT;
    }
    if (a.isTuple()) {
      return compare(a.getTuple(), b.getTuple());
    }
    assert(a.isRef() && b.isRef());
    if (a.isNullable() != b.isNullable()) {
      return a.isNullable() < b.isNullable() ? LT : GT;
    }
    return compare(a.getHeapType(), b.getHeapType());
  }